

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.hpp
# Opt level: O0

int ovf::detail::parse::file_header(ovf_file *file)

{
  bool bVar1;
  parse_error err;
  exception ex;
  bool success;
  undefined1 local_80 [8];
  file_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf> in;
  ovf_file *file_local;
  
  in.super_mmap_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf>.
  super_memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_const_char_*>.
  super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_const_char_*>
  .m_source = (char *)file;
  tao::pegtl::file_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf>::
  mmap_input<char_const*&>
            ((file_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf> *)local_80,
             &file->file_name);
  bVar1 = tao::pegtl::
          parse<ovf::detail::parse::ovf_file_header,_ovf::detail::parse::ovf_file_action,_tao::pegtl::normal,_(tao::pegtl::apply_mode)1,_(tao::pegtl::rewind_mode)1,_tao::pegtl::file_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf>_&,_ovf_file_&>
                    ((file_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf> *)
                     local_80,(ovf_file *)
                              in.
                              super_mmap_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf>
                              .
                              super_memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_const_char_*>
                              .
                              super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_const_char_*>
                              .m_source);
  if (bVar1) {
    file_local._4_4_ = -1;
  }
  else {
    file_local._4_4_ = -3;
  }
  tao::pegtl::file_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf>::~file_input
            ((file_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf> *)local_80);
  return file_local._4_4_;
}

Assistant:

inline int file_header(ovf_file & file)
    try
    {
        pegtl::file_input<> in( file.file_name );
        bool success = pegtl::parse< ovf_file_header, ovf_file_action >( in, file );
        if( success )
            return OVF_OK;
        else
            return OVF_INVALID;
    }
    catch( pegtl::parse_error err )
    {
        file._state->message_latest = fmt::format(
            "libovf initial: pegtl parse error \'{}\'", + err.what());
        return OVF_ERROR;
    }
    catch( std::exception ex )
    {
        file._state->message_latest = fmt::format(
            "libovf initial: std::exception \'{}\'", + ex.what());
        return OVF_ERROR;
    }
    catch( ... )
    {
        file._state->message_latest = "libovf initial: unknown exception";
        return OVF_ERROR;
    }